

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGenerator::GetLinkRule
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *linkRuleVar)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  string *psVar3;
  cmValue local_120;
  cmValue rule;
  string local_f8;
  cmAlphaNum local_d8;
  cmAlphaNum local_a8;
  undefined1 local_78 [8];
  string ruleVar;
  string local_48;
  undefined1 local_21;
  string *local_20;
  string *linkRuleVar_local;
  cmMakefileTargetGenerator *this_local;
  string *linkRule;
  
  local_21 = 0;
  local_20 = linkRuleVar;
  linkRuleVar_local = (string *)this;
  this_local = (cmMakefileTargetGenerator *)__return_storage_ptr__;
  psVar3 = cmMakefile::GetRequiredDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,linkRuleVar);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_48,this);
  bVar2 = cmGeneratorTarget::HasImplibGNUtoMS(pcVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar2) {
    cmAlphaNum::cmAlphaNum(&local_a8,"CMAKE_");
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    GetConfigName_abi_cxx11_((string *)&rule,this);
    cmGeneratorTarget::GetLinkerLanguage(&local_f8,pcVar1,(string *)&rule);
    cmAlphaNum::cmAlphaNum(&local_d8,&local_f8);
    cmStrCat<char[14]>((string *)local_78,&local_a8,&local_d8,(char (*) [14])"_GNUtoMS_RULE");
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&rule);
    local_120 = cmMakefile::GetDefinition
                          ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_78);
    bVar2 = cmValue::operator_cast_to_bool(&local_120);
    if (bVar2) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_120);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar3);
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetLinkRule(
  const std::string& linkRuleVar)
{
  std::string linkRule = this->Makefile->GetRequiredDefinition(linkRuleVar);
  if (this->GeneratorTarget->HasImplibGNUtoMS(this->GetConfigName())) {
    std::string ruleVar =
      cmStrCat("CMAKE_",
               this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName()),
               "_GNUtoMS_RULE");
    if (cmValue rule = this->Makefile->GetDefinition(ruleVar)) {
      linkRule += *rule;
    }
  }
  return linkRule;
}